

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void highbd_inv_txfm_add_16x16_c(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  tran_low_t *in_RDI;
  int32_t *src;
  TX_TYPE tx_type;
  int bd;
  int in_stack_00000474;
  TX_TYPE in_stack_0000047b;
  int in_stack_0000047c;
  uint16_t *in_stack_00000480;
  int32_t *in_stack_00000488;
  
  cast_to_int32(in_RDI);
  av1_inv_txfm2d_add_16x16_c
            (in_stack_00000488,in_stack_00000480,in_stack_0000047c,in_stack_0000047b,
             in_stack_00000474);
  return;
}

Assistant:

static void highbd_inv_txfm_add_16x16_c(const tran_low_t *input, uint8_t *dest,
                                        int stride,
                                        const TxfmParam *txfm_param) {
  int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const int32_t *src = cast_to_int32(input);

  av1_inv_txfm2d_add_16x16_c(src, CONVERT_TO_SHORTPTR(dest), stride, tx_type,
                             bd);
}